

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::setRowVisible(QFormLayout *this,QLayout *layout,bool on)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QFormLayoutPrivate *pQVar4;
  byte in_DL;
  QMessageLogger *in_RSI;
  QLayout *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *d;
  ItemRole role;
  int row;
  int line;
  undefined7 in_stack_ffffffffffffffb8;
  QLayout *otherLayout;
  QLayoutPrivate *in_stack_ffffffffffffffd0;
  QLayout *in_stack_ffffffffffffffd8;
  QFormLayout *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  otherLayout = in_RDI;
  pQVar4 = d_func((QFormLayout *)0x4b8b56);
  line = (int)((ulong)pQVar4 >> 0x20);
  bVar3 = QLayoutPrivate::checkLayout(in_stack_ffffffffffffffd0,otherLayout);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    getLayoutPosition(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                      (int *)in_stack_ffffffffffffffd0,(ItemRole *)otherLayout);
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),line,(char *)in_RDI);
    QMessageLogger::warning(&stack0xffffffffffffffd0,"QFormLayout::setRowVisible: Invalid layout");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::setRowVisible(QLayout *layout, bool on)
{
    Q_D(QFormLayout);
    if (Q_UNLIKELY(!d->checkLayout(layout)))
        return;

    int row;
    ItemRole role;
    getLayoutPosition(layout, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::setRowVisible: Invalid layout");
        return;
    }

    setRowVisible(row, on);
}